

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O2

uchar __thiscall TextFile::bufGetChar(TextFile *this)

{
  ulong uVar1;
  string *psVar2;
  size_t *psVar3;
  
  if (this->fromMemory == true) {
    psVar2 = &this->content;
    uVar1 = this->contentPos;
    psVar3 = &this->contentPos;
  }
  else {
    psVar3 = &this->bufPos;
    uVar1 = this->bufPos;
    if ((this->buf)._M_string_length <= uVar1) {
      bufFillRead(this);
      if ((this->buf)._M_string_length == 0) {
        return '\0';
      }
      uVar1 = *psVar3;
    }
    this->contentPos = this->contentPos + 1;
    psVar2 = &this->buf;
  }
  *psVar3 = uVar1 + 1;
  return (psVar2->_M_dataplus)._M_p[uVar1];
}

Assistant:

inline unsigned char bufGetChar()
	{
		if (fromMemory)
			return content[contentPos++];

		if (buf.size() <= bufPos)
		{
			bufFillRead();
			if (buf.size() == 0)
				return 0;
		}
		++contentPos;
		return buf[bufPos++];
	}